

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PythonDataType.h
# Opt level: O0

Ref<anurbs::Brep> __thiscall
anurbs::PythonDataType<anurbs::Model,_anurbs::Brep>::add_with_attributes
          (PythonDataType<anurbs::Model,_anurbs::Brep> *this,Model *self,Pointer<anurbs::Brep> *data
          ,string *attributes)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ref<anurbs::Brep> RVar1;
  undefined1 local_38 [24];
  string *attributes_local;
  Pointer<anurbs::Brep> *data_local;
  Model *self_local;
  
  local_38._16_8_ = attributes;
  attributes_local = (string *)data;
  data_local = (Pointer<anurbs::Brep> *)self;
  self_local = (Model *)this;
  std::shared_ptr<anurbs::Brep>::shared_ptr((shared_ptr<anurbs::Brep> *)local_38,data);
  Model::add<anurbs::Brep>((Model *)this,(Pointer<anurbs::Brep> *)self,(string *)local_38);
  std::shared_ptr<anurbs::Brep>::~shared_ptr((shared_ptr<anurbs::Brep> *)local_38);
  RVar1.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Brep>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  RVar1.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Brep>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ref<anurbs::Brep>)
         RVar1.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Brep>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Ref<TData> add_with_attributes(TModel& self, Pointer<TData> data,
        const std::string& attributes)
    {
        return self.template add<TData>(data, attributes);
    }